

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIA.hpp
# Opt level: O0

void __thiscall
Atari2600::TIA::Player::skip_pixels(Player *this,int count,int from_horizontal_counter)

{
  int *piVar1;
  int local_24 [3];
  int local_18;
  int old_pixel_counter;
  int from_horizontal_counter_local;
  int count_local;
  Player *this_local;
  
  local_24[2] = this->pixel_counter;
  local_24[1] = 0x20;
  local_24[0] = this->pixel_position + count * this->adder;
  local_18 = from_horizontal_counter;
  old_pixel_counter = count;
  _from_horizontal_counter_local = this;
  piVar1 = std::min<int>(local_24 + 1,local_24);
  this->pixel_position = *piVar1;
  this->pixel_counter = old_pixel_counter + this->pixel_counter;
  if (((this->copy_index_ == 0) && (local_24[2] < 4)) && (3 < this->pixel_counter)) {
    this->latched_pixel4_time = (local_18 + 4) - local_24[2];
  }
  return;
}

Assistant:

inline void skip_pixels(const int count, int from_horizontal_counter) {
				int old_pixel_counter = pixel_counter;
				pixel_position = std::min(32, pixel_position + count * adder);
				pixel_counter += count;
				if(!copy_index_ && old_pixel_counter < 4 && pixel_counter >= 4) {
					latched_pixel4_time = from_horizontal_counter + 4 - old_pixel_counter;
				}
			}